

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

void EnterCriticalSection(LPCRITICAL_SECTION lpCriticalSection)

{
  CPalThread *pThread_00;
  CPalThread *pThread;
  LPCRITICAL_SECTION lpCriticalSection_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pThread_00 = CorUnix::InternalGetCurrentThread();
  CorUnix::InternalEnterCriticalSection(pThread_00,lpCriticalSection);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return;
}

Assistant:

void EnterCriticalSection(LPCRITICAL_SECTION lpCriticalSection)
{
    PERF_ENTRY(EnterCriticalSection);
    ENTRY("EnterCriticalSection(lpCriticalSection=%p)\n", lpCriticalSection);

    CPalThread * pThread = InternalGetCurrentThread();

    InternalEnterCriticalSection(pThread, lpCriticalSection);

    LOGEXIT("EnterCriticalSection returns void\n");
    PERF_EXIT(EnterCriticalSection);
}